

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

void __thiscall vera::Image::Image(Image *this)

{
  this->_vptr_Image = (_func_int **)&PTR__Image_003ec988;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->m_path)._M_dataplus._M_p = (pointer)&(this->m_path).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_path,"");
  (this->m_data).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->m_width = 0;
  this->m_height = 0;
  (this->m_data).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_data).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  this->m_channels = 0;
  return;
}

Assistant:

Image::Image(): m_path(""), m_width(0), m_height(0), m_channels(0) {
}